

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCurrentTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1122e::TestCanSetandGetDetails::~TestCanSetandGetDetails
          (TestCanSetandGetDetails *this)

{
  TestCanSetandGetDetails *this_local;
  
  ~TestCanSetandGetDetails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CanSetandGetDetails)
{
	bool ok = false;
	{
		ScopedCurrentTest scopedTest;

		const UnitTest::TestDetails* details = reinterpret_cast< const UnitTest::TestDetails* >(12345);
		UnitTest::CurrentTest::Details() = details;

		ok = (UnitTest::CurrentTest::Details() == details);
	}

	CHECK(ok);
}